

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest::iterate
          (GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest *this)

{
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  float fVar5;
  float fVar6;
  GLboolean bool_value;
  GLint int_value;
  GLfloat float_value;
  char local_29;
  int local_28;
  float local_24;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  cVar1 = (**(code **)(lVar4 + 0xc70))(0x8e51);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Unexpected error generated by glIsEnabled(GL_SAMPLE_MASK) call.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x202);
  if (cVar1 == '\0') {
    local_29 = '\x01';
    local_24 = 1.0;
    local_28 = 1;
    (**(code **)(lVar4 + 0x798))(0x8e51,&local_29);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,
                    "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                    ,0x20f);
    if (local_29 == '\0') {
      (**(code **)(lVar4 + 0x818))(0x8e51,&local_24);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,
                      "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                      ,0x217);
      fVar6 = -local_24;
      if (-local_24 <= local_24) {
        fVar6 = local_24;
      }
      if (1e-05 < fVar6) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid float value reported for GL_SAMPLE_MASK property",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                   ,0x21b);
      }
      else {
        (**(code **)(lVar4 + 0x868))(0x8e51,&local_28);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,
                        "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                        ,0x21f);
        if (local_28 == 0) {
          (**(code **)(lVar4 + 0x5e0))(0x8e51);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"glEnable(GL_SAMPLE_MASK) call generated an unexpected error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                          ,0x229);
          cVar1 = (**(code **)(lVar4 + 0xc70))(0x8e51);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                          ,0x22d);
          if (cVar1 == '\x01') {
            (**(code **)(lVar4 + 0x798))(0x8e51,&local_29);
            dVar3 = (**(code **)(lVar4 + 0x800))();
            glu::checkError(dVar3,
                            "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                            ,0x236);
            if (local_29 == '\x01') {
              (**(code **)(lVar4 + 0x818))(0x8e51,&local_24);
              dVar3 = (**(code **)(lVar4 + 0x800))();
              glu::checkError(dVar3,
                              "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                              ,0x23e);
              fVar5 = local_24 + -1.0;
              fVar6 = -fVar5;
              if (-fVar5 <= fVar5) {
                fVar6 = fVar5;
              }
              if (1e-05 < fVar6) {
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Invalid float value reported for GL_SAMPLE_MASK property",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                           ,0x242);
              }
              else {
                (**(code **)(lVar4 + 0x868))(0x8e51,&local_28);
                dVar3 = (**(code **)(lVar4 + 0x800))();
                glu::checkError(dVar3,
                                "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                ,0x246);
                if (local_28 == 1) {
                  (**(code **)(lVar4 + 0x4e8))(0x8e51);
                  dVar3 = (**(code **)(lVar4 + 0x800))();
                  glu::checkError(dVar3,
                                  "glDisable(GL_SAMPLE_MASK) call generated an unexpected error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                  ,0x24f);
                  cVar1 = (**(code **)(lVar4 + 0xc70))(0x8e51);
                  dVar3 = (**(code **)(lVar4 + 0x800))();
                  glu::checkError(dVar3,
                                  "glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                  ,0x252);
                  if (cVar1 == '\0') {
                    (**(code **)(lVar4 + 0x798))(0x8e51,&local_29);
                    dVar3 = (**(code **)(lVar4 + 0x800))();
                    glu::checkError(dVar3,
                                    "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                    ,0x25b);
                    if (local_29 == '\0') {
                      (**(code **)(lVar4 + 0x818))(0x8e51,&local_24);
                      dVar3 = (**(code **)(lVar4 + 0x800))();
                      glu::checkError(dVar3,
                                      "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                      ,0x263);
                      fVar6 = -local_24;
                      if (-local_24 <= local_24) {
                        fVar6 = local_24;
                      }
                      if (1e-05 < fVar6) {
                        this_00 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (this_00,
                                   "Invalid float value reported for GL_SAMPLE_MASK property",
                                   (char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                   ,0x267);
                      }
                      else {
                        (**(code **)(lVar4 + 0x868))(0x8e51,&local_28);
                        dVar3 = (**(code **)(lVar4 + 0x800))();
                        glu::checkError(dVar3,
                                        "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                        ,0x26b);
                        if (local_28 == 0) {
                          tcu::TestContext::setTestResult
                                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                                     QP_TEST_RESULT_PASS,"Pass");
                          return STOP;
                        }
                        this_00 = (TestError *)__cxa_allocate_exception(0x38);
                        tcu::TestError::TestError
                                  (this_00,
                                   "Invalid integer value reported for GL_SAMPLE_MASK property",
                                   (char *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                   ,0x26f);
                      }
                    }
                    else {
                      this_00 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (this_00,
                                 "Invalid boolean value reported for GL_SAMPLE_MASK property",
                                 (char *)0x0,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                                 ,0x25f);
                    }
                  }
                  else {
                    this_00 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (this_00,
                               "glIsEnabled(GL_SAMPLE_MASK) did not report GL_FALSE after a successful glDisable(GL_SAMPLE_MASK) call."
                               ,(char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                               ,599);
                  }
                }
                else {
                  this_00 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (this_00,"Invalid integer value reported for GL_SAMPLE_MASK property",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                             ,0x24a);
                }
              }
            }
            else {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Invalid boolean value reported for GL_SAMPLE_MASK property",
                         (char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                         ,0x23a);
            }
          }
          else {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,
                       "glIsEnabled(GL_SAMPLE_MASK) did not report GL_TRUE after a successful glEnable(GL_SAMPLE_MASK) call."
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                       ,0x232);
          }
        }
        else {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid integer value reported for GL_SAMPLE_MASK property",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                     ,0x223);
        }
      }
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid boolean value reported for GL_SAMPLE_MASK property",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                 ,0x213);
    }
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"GL_SAMPLE_MASK mode is considered enabled by default which is incorrect.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x206);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest::iterate()
{
	const float			  epsilon = (float)1e-5;
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();

	/* Check GL_SAMPLE_MASK is disabled by default */
	glw::GLint enabled = gl.isEnabled(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Unexpected error generated by glIsEnabled(GL_SAMPLE_MASK) call.");

	if (enabled != GL_FALSE)
	{
		TCU_FAIL("GL_SAMPLE_MASK mode is considered enabled by default which is incorrect.");
	}

	/* Verify glGet*() calls also report the mode to be disabled */
	glw::GLboolean bool_value  = GL_TRUE;
	glw::GLfloat   float_value = 1.0f;
	glw::GLint	 int_value   = 1;

	gl.getBooleanv(GL_SAMPLE_MASK, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property");

	if (bool_value != GL_FALSE)
	{
		TCU_FAIL("Invalid boolean value reported for GL_SAMPLE_MASK property");
	}

	gl.getFloatv(GL_SAMPLE_MASK, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property");

	if (de::abs(float_value - float(GL_FALSE)) > epsilon)
	{
		TCU_FAIL("Invalid float value reported for GL_SAMPLE_MASK property");
	}

	gl.getIntegerv(GL_SAMPLE_MASK, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property");

	if (int_value != GL_FALSE)
	{
		TCU_FAIL("Invalid integer value reported for GL_SAMPLE_MASK property");
	}

	/* Enable GL_SAMPLE_MASK mode */
	gl.enable(GL_SAMPLE_MASK);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_SAMPLE_MASK) call generated an unexpected error");

	/* Verify values reported by glIsEnabled(), as well as GL getters is still correct */
	enabled = gl.isEnabled(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error");

	if (enabled != GL_TRUE)
	{
		TCU_FAIL(
			"glIsEnabled(GL_SAMPLE_MASK) did not report GL_TRUE after a successful glEnable(GL_SAMPLE_MASK) call.");
	}

	gl.getBooleanv(GL_SAMPLE_MASK, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property");

	if (bool_value != GL_TRUE)
	{
		TCU_FAIL("Invalid boolean value reported for GL_SAMPLE_MASK property");
	}

	gl.getFloatv(GL_SAMPLE_MASK, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property");

	if (de::abs(float_value - float(GL_TRUE)) > epsilon)
	{
		TCU_FAIL("Invalid float value reported for GL_SAMPLE_MASK property");
	}

	gl.getIntegerv(GL_SAMPLE_MASK, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property");

	if (int_value != GL_TRUE)
	{
		TCU_FAIL("Invalid integer value reported for GL_SAMPLE_MASK property");
	}

	/* Disable the mode and see if the getters react accordingly */
	gl.disable(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_SAMPLE_MASK) call generated an unexpected error");

	enabled = gl.isEnabled(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error");

	if (enabled != GL_FALSE)
	{
		TCU_FAIL(
			"glIsEnabled(GL_SAMPLE_MASK) did not report GL_FALSE after a successful glDisable(GL_SAMPLE_MASK) call.");
	}

	gl.getBooleanv(GL_SAMPLE_MASK, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property");

	if (bool_value != GL_FALSE)
	{
		TCU_FAIL("Invalid boolean value reported for GL_SAMPLE_MASK property");
	}

	gl.getFloatv(GL_SAMPLE_MASK, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property");

	if (de::abs(float_value - float(GL_FALSE)) > epsilon)
	{
		TCU_FAIL("Invalid float value reported for GL_SAMPLE_MASK property");
	}

	gl.getIntegerv(GL_SAMPLE_MASK, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property");

	if (int_value != GL_FALSE)
	{
		TCU_FAIL("Invalid integer value reported for GL_SAMPLE_MASK property");
	}

	/* All good! */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}